

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void auxsetstr(lua_State *L,TValue *t,char *k)

{
  StkId pSVar1;
  TString *key;
  TValue *slot;
  TValue *io1;
  long lVar2;
  
  key = luaS_new(L,k);
  if (t->tt_ == 'E') {
    slot = luaH_getstr((Table *)(t->value_).gc,key);
    if ((slot->tt_ & 0xf) != 0) {
      lVar2 = (L->top).offset;
      slot->value_ = *(Value *)(lVar2 + -0x10);
      slot->tt_ = *(lu_byte *)(lVar2 + -8);
      lVar2 = -0x10;
      if ((((*(byte *)((L->top).offset + -8) & 0x40) != 0) &&
          ((((t->value_).gc)->marked & 0x20) != 0)) &&
         ((*(byte *)(*(long *)((L->top).offset + -0x10) + 9) & 0x18) != 0)) {
        luaC_barrierback_(L,(t->value_).gc);
      }
      goto LAB_00107b49;
    }
  }
  else {
    slot = (TValue *)0x0;
  }
  pSVar1 = (L->top).p;
  *(TString **)pSVar1 = key;
  (pSVar1->val).tt_ = key->tt | 0x40;
  pSVar1 = (L->top).p;
  (L->top).p = pSVar1 + 1;
  luaV_finishset(L,t,&pSVar1->val,&pSVar1[-1].val,slot);
  lVar2 = -0x20;
LAB_00107b49:
  (L->top).p = (StkId)((long)(L->top).p + lVar2);
  return;
}

Assistant:

static void auxsetstr (lua_State *L, const TValue *t, const char *k) {
  const TValue *slot;
  TString *str = luaS_new(L, k);
  api_checknelems(L, 1);
  if (luaV_fastget(L, t, str, slot, luaH_getstr)) {
    luaV_finishfastset(L, t, slot, s2v(L->top.p - 1));
    L->top.p--;  /* pop value */
  }
  else {
    setsvalue2s(L, L->top.p, str);  /* push 'str' (to make it a TValue) */
    api_incr_top(L);
    luaV_finishset(L, t, s2v(L->top.p - 1), s2v(L->top.p - 2), slot);
    L->top.p -= 2;  /* pop value and key */
  }
  lua_unlock(L);  /* lock done by caller */
}